

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrlc.c
# Opt level: O2

void osqp_start_interrupt_listener(void)

{
  sigaction act;
  
  int_detected = 0;
  act.sa_flags = 0;
  sigemptyset((sigset_t *)&act.sa_mask);
  act.__sigaction_handler.sa_handler = handle_ctrlc;
  sigaction(2,(sigaction *)&act,(sigaction *)&oact);
  return;
}

Assistant:

void osqp_start_interrupt_listener(void) {
  struct sigaction act;

  int_detected = 0;
  act.sa_flags = 0;
  sigemptyset(&act.sa_mask);
  act.sa_handler = handle_ctrlc;
  sigaction(SIGINT, &act, &oact);
}